

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlParserErrors
xmlFindExtraHandler(char *norig,char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,
                   void *implCtxt,xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  xmlParserErrors xVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *inputCtxt;
  undefined8 *outputCtxt;
  iconv_t pvVar5;
  int *piVar6;
  xmlParserErrors xVar7;
  code *output;
  xmlIconvCtxt *ctxt;
  long lVar8;
  xmlIconvCtxt *ctxt_1;
  code *input;
  
  if (impl != (xmlCharEncConvImpl)0x0) {
    xVar2 = (*impl)(implCtxt,norig,flags,out);
    return xVar2;
  }
  if ((globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) && (0 < nbCharEncodingHandler)) {
    lVar8 = 0;
    do {
      pxVar1 = globalHandlers[lVar8];
      iVar3 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
      if (((iVar3 == 0) &&
          (((flags & XML_ENC_INPUT) == 0 || ((pxVar1->input).func != (xmlCharEncConvFunc)0x0)))) &&
         (((flags & XML_ENC_OUTPUT) == 0 || ((pxVar1->output).func != (xmlCharEncConvFunc)0x0)))) {
        *out = pxVar1;
        return XML_ERR_OK;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < nbCharEncodingHandler);
  }
  pcVar4 = strstr(name,"//");
  if (pcVar4 != (char *)0x0) {
    return XML_ERR_UNSUPPORTED_ENCODING;
  }
  if ((flags & XML_ENC_INPUT) == 0) {
    inputCtxt = (undefined8 *)0x0;
    input = (xmlCharEncConvFunc)0x0;
LAB_00129933:
    if ((flags & XML_ENC_OUTPUT) == 0) {
      output = (xmlCharEncConvFunc)0x0;
      outputCtxt = (undefined8 *)0x0;
LAB_001299a9:
      xVar2 = xmlCharEncNewCustomHandler(name,input,output,xmlIconvFree,inputCtxt,outputCtxt,out);
      return xVar2;
    }
    outputCtxt = (undefined8 *)(*xmlMalloc)(8);
    if (outputCtxt == (undefined8 *)0x0) {
      xVar2 = XML_ERR_NO_MEMORY;
    }
    else {
      *outputCtxt = 0xffffffffffffffff;
      pvVar5 = iconv_open(name,"UTF-8");
      if (pvVar5 != (iconv_t)0xffffffffffffffff) {
        *outputCtxt = pvVar5;
        output = xmlIconvConvert;
        goto LAB_001299a9;
      }
      piVar6 = __errno_location();
      xVar7 = XML_ERR_SYSTEM;
      if (*piVar6 == 0xc) {
        xVar7 = XML_ERR_NO_MEMORY;
      }
      xVar2 = XML_ERR_UNSUPPORTED_ENCODING;
      if (*piVar6 != 0x16) {
        xVar2 = xVar7;
      }
    }
    if (inputCtxt == (undefined8 *)0x0) goto LAB_00129a35;
  }
  else {
    inputCtxt = (undefined8 *)(*xmlMalloc)(8);
    if (inputCtxt == (undefined8 *)0x0) {
      return XML_ERR_NO_MEMORY;
    }
    *inputCtxt = 0xffffffffffffffff;
    pvVar5 = iconv_open("UTF-8",name);
    if (pvVar5 != (iconv_t)0xffffffffffffffff) {
      *inputCtxt = pvVar5;
      input = xmlIconvConvert;
      goto LAB_00129933;
    }
    piVar6 = __errno_location();
    if (*piVar6 == 0x16) {
      xVar2 = XML_ERR_UNSUPPORTED_ENCODING;
    }
    else if (*piVar6 == 0xc) {
      xVar2 = XML_ERR_NO_MEMORY;
    }
    else {
      xVar2 = XML_ERR_SYSTEM;
    }
    outputCtxt = (undefined8 *)0x0;
  }
  if ((iconv_t)*inputCtxt != (iconv_t)0xffffffffffffffff) {
    iconv_close((iconv_t)*inputCtxt);
  }
  (*xmlFree)(inputCtxt);
LAB_00129a35:
  if (outputCtxt != (undefined8 *)0x0) {
    if ((iconv_t)*outputCtxt != (iconv_t)0xffffffffffffffff) {
      iconv_close((iconv_t)*outputCtxt);
    }
    (*xmlFree)(outputCtxt);
  }
  return xVar2;
}

Assistant:

static xmlParserErrors
xmlFindExtraHandler(const char *norig, const char *name, xmlCharEncFlags flags,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL)
        return(impl(implCtxt, norig, flags, out));

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        int i;

        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((((flags & XML_ENC_INPUT) == 0) || (h->input.func)) &&
                    (((flags & XML_ENC_OUTPUT) == 0) || (h->output.func))) {
                    *out = h;
                    return(XML_ERR_OK);
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    {
        int ret = xmlCharEncIconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    {
        int ret = xmlCharEncUconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICU_ENABLED */

    return(XML_ERR_UNSUPPORTED_ENCODING);
}